

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

char * GetPrevDirectoryPath(char *dirPath)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  long lVar5;
  
  memset(GetPrevDirectoryPath::prevDirPath,0,0x1000);
  sVar1 = strlen(dirPath);
  if ((int)(uint)sVar1 < 4) {
    strcpy(GetPrevDirectoryPath::prevDirPath,dirPath);
LAB_00126772:
    return GetPrevDirectoryPath::prevDirPath;
  }
  lVar2 = (ulong)((uint)sVar1 & 0x7fffffff) + 1;
  do {
    lVar5 = lVar2;
    lVar2 = lVar5 + -1;
    if (lVar2 < 1) goto LAB_00126772;
  } while ((dirPath[lVar5 + -2] != '\\') && (dirPath[lVar5 + -2] != '/'));
  if ((int)lVar2 != 1) {
    if ((int)lVar2 == 3) {
      uVar4 = 2;
      if (dirPath[1] != ':') goto LAB_00126787;
    }
    else {
      lVar2 = lVar5 + -2;
    }
  }
  uVar4 = (uint)lVar2;
LAB_00126787:
  pcVar3 = strncpy(GetPrevDirectoryPath::prevDirPath,dirPath,(ulong)uVar4);
  return pcVar3;
}

Assistant:

const char *GetPrevDirectoryPath(const char *dirPath)
{
    static char prevDirPath[MAX_FILEPATH_LENGTH];
    memset(prevDirPath, 0, MAX_FILEPATH_LENGTH);
    int pathLen = (int)strlen(dirPath);

    if (pathLen <= 3) strcpy(prevDirPath, dirPath);

    for (int i = (pathLen - 1); (i >= 0) && (pathLen > 3); i--)
    {
        if ((dirPath[i] == '\\') || (dirPath[i] == '/'))
        {
            // Check for root: "C:\" or "/"
            if (((i == 2) && (dirPath[1] ==':')) || (i == 0)) i++;

            strncpy(prevDirPath, dirPath, i);
            break;
        }
    }

    return prevDirPath;
}